

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O3

void msd_D_adaptive<std::vector<unsigned_char*,std::allocator<unsigned_char*>>>
               (uchar **strings,size_t n,size_t depth,
               vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets)

{
  vector<unsigned_char*,std::allocator<unsigned_char*>> *pvVar1;
  long *plVar2;
  uchar *puVar3;
  iterator iVar4;
  long lVar5;
  size_t n_00;
  size_t j;
  long *__ptr;
  long lVar6;
  pointer *pppuVar7;
  ushort uVar8;
  size_t __n;
  uchar **__args;
  uchar **ppuVar9;
  uint i;
  size_t j_1;
  long lVar10;
  ulong uVar11;
  uint16_t cache [16];
  ushort auStack_58 [20];
  
  if (n < 0x10000) {
    msd_D<std::vector<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
              (strings,n,depth,buckets);
    return;
  }
  __ptr = (long *)malloc(0x80000);
  if ((n & 0xfffffffffffffff0) == 0) {
    uVar11 = 0;
  }
  else {
    uVar11 = 0;
    ppuVar9 = strings;
    do {
      lVar6 = 0;
      do {
        puVar3 = ppuVar9[lVar6];
        if (puVar3 == (uchar *)0x0) goto LAB_002048bb;
        if (puVar3[depth] == '\0') {
          uVar8 = 0;
        }
        else {
          uVar8 = CONCAT11(puVar3[depth],puVar3[depth + 1]);
        }
        auStack_58[lVar6] = uVar8;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x10);
      lVar6 = 0;
      __args = ppuVar9;
      do {
        pvVar1 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)
                 (buckets + auStack_58[lVar6]);
        iVar4._M_current = *(uchar ***)(pvVar1 + 8);
        if (iVar4._M_current == *(uchar ***)(pvVar1 + 0x10)) {
          std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_realloc_insert<unsigned_char*const&>(pvVar1,iVar4,__args);
        }
        else {
          *iVar4._M_current = *__args;
          *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
        }
        lVar6 = lVar6 + 1;
        __args = __args + 1;
      } while (lVar6 != 0x10);
      uVar11 = uVar11 + 0x10;
      ppuVar9 = ppuVar9 + 0x10;
    } while (uVar11 < (n & 0xfffffffffffffff0));
  }
  lVar6 = n - uVar11;
  if (uVar11 <= n && lVar6 != 0) {
    ppuVar9 = strings + uVar11;
    do {
      puVar3 = *ppuVar9;
      if (puVar3 == (uchar *)0x0) {
LAB_002048bb:
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/util/get_char.h"
                      ,0x2e,"uint16_t get_char(unsigned char *, size_t)");
      }
      if (puVar3[depth] == '\0') {
        uVar11 = 0;
      }
      else {
        uVar11 = (ulong)CONCAT11(puVar3[depth],puVar3[depth + 1]);
      }
      pvVar1 = (vector<unsigned_char*,std::allocator<unsigned_char*>> *)(buckets + uVar11);
      iVar4._M_current = *(uchar ***)(pvVar1 + 8);
      if (iVar4._M_current == *(uchar ***)(pvVar1 + 0x10)) {
        std::vector<unsigned_char*,std::allocator<unsigned_char*>>::
        _M_realloc_insert<unsigned_char*const&>(pvVar1,iVar4,ppuVar9);
      }
      else {
        *iVar4._M_current = puVar3;
        *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
      }
      ppuVar9 = ppuVar9 + 1;
      lVar6 = lVar6 + -1;
    } while (lVar6 != 0);
  }
  pppuVar7 = &buckets[1].super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = 0;
  do {
    uVar11 = (long)*pppuVar7 - (long)((_Vector_impl_data *)(pppuVar7 + -1))->_M_start;
    plVar2 = __ptr + lVar6;
    *plVar2 = CONCAT44((int)((long)pppuVar7[-3] - (long)pppuVar7[-4] >> 0x23),
                       (int)((ulong)((long)pppuVar7[-3] - (long)pppuVar7[-4]) >> 3));
    *(int *)(plVar2 + 2) = (int)(uVar11 >> 3);
    *(int *)((long)plVar2 + 0x14) = (int)((long)uVar11 >> 0x23);
    lVar6 = lVar6 + 2;
    pppuVar7 = pppuVar7 + 6;
  } while (lVar6 != 0x10000);
  pppuVar7 = &(buckets->super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
  lVar6 = 0;
  lVar10 = 0;
  do {
    lVar5 = __ptr[lVar6];
    if (lVar5 != 0) {
      __n = (long)*pppuVar7 - (long)((_Vector_impl_data *)(pppuVar7 + -1))->_M_start;
      if (__n != 0) {
        memmove(strings + lVar10,((_Vector_impl_data *)(pppuVar7 + -1))->_M_start,__n);
      }
      lVar10 = lVar10 + lVar5;
    }
    lVar6 = lVar6 + 1;
    pppuVar7 = pppuVar7 + 3;
  } while (lVar6 != 0x10000);
  lVar6 = 8;
  do {
    lVar10 = *(long *)((long)buckets + lVar6 + -8);
    if (*(long *)((long)&(buckets->
                         super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                         _M_impl.super__Vector_impl_data._M_start + lVar6) != lVar10) {
      *(long *)((long)&(buckets->
                       super__Vector_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start + lVar6) = lVar10;
    }
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0x180008);
  lVar6 = *__ptr;
  lVar10 = 1;
  do {
    n_00 = __ptr[lVar10];
    if (n_00 != 0) {
      if ((char)lVar10 != '\0') {
        msd_D_adaptive<std::vector<unsigned_char*,std::allocator<unsigned_char*>>>
                  (strings + lVar6,n_00,depth + 2,buckets);
      }
      lVar6 = lVar6 + n_00;
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 0x10000);
  free(__ptr);
  return;
}

Assistant:

static void
msd_D_adaptive(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 0x10000) {
		msd_D<Bucket, uint16_t>(strings, n, depth, buckets);
		return;
	}
	size_t* bucketsize = (size_t*) malloc(0x10000 * sizeof(size_t));
	size_t i=0;
	for (; i < n-n%16; i+=16) {
		uint16_t cache[16];
		for (size_t j=0; j < 16; ++j) {
			cache[j] = get_char<uint16_t>(strings[i+j], depth);
		}
		for (size_t j=0; j < 16; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		const uint16_t ch = get_char<uint16_t>(strings[i], depth);
		buckets[ch].push_back(strings[i]);
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 0x10000; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 0x10000; ++i) {
		if (bucketsize[i] == 0) continue;
		if (i & 0xFF) msd_D_adaptive(
				strings+pos, bucketsize[i],
				depth+2, buckets);
		pos += bucketsize[i];
	}
	free(bucketsize);
}